

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicsLinearization.cpp
# Opt level: O2

void iDynTree::ForwardDynamicsLinearizationWrtBaseTwist
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,LinkNetExternalWrenches *linkExtWrenches,
               JointDOFsDoubleArray *jointTorques,ForwardDynamicsLinearizationInternalBuffers *bufs,
               FreeFloatingAcc *robotAcc,FreeFloatingStateLinearization *A)

{
  DOFSpatialForceArray *this;
  JointDOFsDoubleArray *this_00;
  LinkPositions *this_01;
  LinkArticulatedBodyInertias *this_02;
  pointer pSVar1;
  pointer pSVar2;
  pointer pMVar3;
  uint uVar4;
  int iVar5;
  Link *pLVar6;
  LinkIndex LVar7;
  IJoint *pIVar8;
  LinkIndex LVar9;
  JointPosDoubleArray *pJVar10;
  LinkIndex LVar11;
  undefined4 extraout_var;
  Transform *pTVar12;
  undefined4 extraout_var_00;
  VectorDynSize *this_03;
  undefined4 extraout_var_01;
  ArticulatedBodyInertia *pAVar13;
  double *pdVar14;
  SpatialMotionVector *pSVar15;
  SpatialForceVector *pSVar16;
  undefined4 extraout_var_02;
  undefined8 *puVar17;
  size_t sVar18;
  size_t sVar19;
  ulong uVar20;
  double dVar21;
  ArticulatedBodyInertia Ia;
  Matrix6x6 dVb_pa;
  HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *local_480 [2];
  undefined1 local_470 [16];
  variable_if_dynamic<long,__1> local_460;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
  *local_458;
  pointer local_450;
  pointer local_448;
  Matrix<double,_6,_1,_0,_6,_1> *local_430;
  pointer local_428;
  scalar_constant_op<double> local_410;
  Matrix<double,_6,_1,_0,_6,_1> local_3f8;
  undefined1 local_3c8 [288];
  SpatialMotionVector local_2a8 [4];
  HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> local_1c8;
  
  this_01 = &bufs->linkPos;
  uVar20 = 0;
  while( true ) {
    uVar4 = Traversal::getNrOfVisitedLinks(traversal);
    if (uVar4 <= uVar20) break;
    pLVar6 = Traversal::getLink(traversal,uVar20);
    LVar7 = Link::getIndex(pLVar6);
    pLVar6 = Traversal::getParentLink(traversal,uVar20);
    pIVar8 = Traversal::getParentJoint(traversal,uVar20);
    if (pLVar6 == (Link *)0x0) {
      iDynTree::Transform::Identity();
      pTVar12 = LinkPositions::operator()(this_01,LVar7);
      iDynTree::Transform::operator=(pTVar12,(Transform *)&local_1c8);
      MatrixFixSize<6U,_6U>::zero
                (&(bufs->dVb_linkBiasAcceleration).
                  super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                  ._M_impl.super__Vector_impl_data._M_start[LVar7].super_Matrix6x6);
    }
    else {
      LVar9 = Link::getIndex(pLVar6);
      pJVar10 = FreeFloatingPos::jointPos(robotPos);
      LVar11 = Link::getIndex(pLVar6);
      iVar5 = (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar10,LVar7,LVar11);
      LinkPositions::operator()(this_01,LVar9);
      iDynTree::Transform::operator*
                ((Transform *)&local_1c8,(Transform *)CONCAT44(extraout_var,iVar5));
      pTVar12 = LinkPositions::operator()(this_01,LVar7);
      iDynTree::Transform::operator=(pTVar12,(Transform *)&local_1c8);
      iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
      if (iVar5 == 0) {
        MatrixFixSize<6U,_6U>::zero
                  (&(bufs->dVb_linkBiasAcceleration).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start[LVar7].super_Matrix6x6);
      }
      else {
        iVar5 = (*pIVar8->_vptr_IJoint[0x18])(pIVar8);
        this_03 = &FreeFloatingVel::jointVel(robotVel)->super_VectorDynSize;
        dVar21 = (double)iDynTree::VectorDynSize::operator()
                                   (this_03,CONCAT44(extraout_var_00,iVar5));
        DOFSpatialMotionArray::operator()
                  ((DOFSpatialMotionArray *)bufs,CONCAT44(extraout_var_00,iVar5));
        iDynTree::SpatialMotionVector::operator*(local_2a8,-dVar21);
        iDynTree::SpatialMotionVector::asCrossProductMatrix();
        LinkPositions::operator()(this_01,LVar7);
        iDynTree::Transform::asAdjointTransform();
        local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[0] = (double)((bufs->dVb_linkBiasAcceleration).
                            super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                            ._M_impl.super__Vector_impl_data._M_start + LVar7);
        local_470._0_8_ = &local_1c8;
        local_460.m_value = (long)local_3c8;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,0>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)&local_3f8,
                   (Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                    *)local_470);
      }
    }
    pSVar1 = (bufs->dVl_linkLocalBiasWrench).
             super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
             ._M_impl.super__Vector_impl_data._M_start;
    LinkPositions::operator()(this_01,LVar7);
    iDynTree::Transform::asAdjointTransform();
    local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
    [0] = (double)((bufs->dVb_linkBiasWrench).
                   super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                   ._M_impl.super__Vector_impl_data._M_start + LVar7);
    local_3c8._0_8_ = (HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)(pSVar1 + LVar7);
    local_3c8._16_8_ = &local_1c8;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,0>>
              ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_2a8,
               (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)local_3c8);
    uVar20 = uVar20 + 1;
  }
  uVar4 = Traversal::getNrOfVisitedLinks(traversal);
  this_02 = &(bufs->aba).linkABIs;
  this = &(bufs->aba).U;
  this_00 = &(bufs->aba).D;
  while( true ) {
    uVar4 = uVar4 - 1;
    if ((int)uVar4 < 0) break;
    uVar20 = (ulong)(uVar4 & 0x7fffffff);
    pLVar6 = Traversal::getLink(traversal,uVar20);
    LVar7 = Link::getIndex(pLVar6);
    pLVar6 = Traversal::getParentLink(traversal,uVar20);
    pIVar8 = Traversal::getParentJoint(traversal,uVar20);
    if (pLVar6 != (Link *)0x0) {
      iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia((ArticulatedBodyInertia *)local_2a8);
      iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
      if (iVar5 != 0) {
        iVar5 = (*pIVar8->_vptr_IJoint[0x18])(pIVar8);
        sVar19 = CONCAT44(extraout_var_01,iVar5);
        pAVar13 = LinkArticulatedBodyInertias::operator()(this_02,LVar7);
        DOFSpatialForceArray::operator()(this,sVar19);
        pdVar14 = (double *)
                  iDynTree::VectorDynSize::operator()(&this_00->super_VectorDynSize,sVar19);
        iDynTree::ArticulatedBodyInertia::ABADyadHelper((SpatialForceVector *)local_3c8,*pdVar14);
        iDynTree::ArticulatedBodyInertia::operator-((ArticulatedBodyInertia *)&local_1c8,pAVar13);
        memcpy(local_2a8,&local_1c8,0xd8);
        pSVar15 = DOFSpatialMotionArray::operator()((DOFSpatialMotionArray *)bufs,sVar19);
        toEigen((Matrix<double,_6,_1,_0,_6,_1> *)&local_1c8,pSVar15);
        local_3c8._16_8_ =
             (bufs->dVb_linkBiasWrench).
             super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
             ._M_impl.super__Vector_impl_data._M_start + LVar7;
        local_470._0_8_ =
             (bufs->dVb_u).
             super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
             ._M_impl.super__Vector_impl_data._M_start + sVar19;
        local_3c8._0_8_ = &local_1c8;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>const>const>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>>
                  ((Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_> *)local_470,
                   (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                    *)local_3c8);
        pSVar1 = (bufs->dVb_linkBiasWrench).
                 super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iDynTree::ArticulatedBodyInertia::asMatrix();
        pSVar2 = (bufs->dVb_linkBiasAcceleration).
                 super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar16 = DOFSpatialForceArray::operator()(this,sVar19);
        toEigen(&local_3f8,pSVar16);
        pMVar3 = (bufs->dVb_u).
                 super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)
                  iDynTree::VectorDynSize::operator()(&this_00->super_VectorDynSize,sVar19);
        local_410.m_other = *pdVar14;
        local_480[0] = &local_1c8;
        local_430 = &local_3f8;
        local_470._8_8_ = pSVar1 + LVar7;
        local_458 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                     *)local_3c8;
        local_448 = pSVar2 + LVar7;
        local_428 = pMVar3 + sVar19;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>const>const>const>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_480,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>_>
                    *)local_470);
      }
      iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
      if (iVar5 == 0) {
        pAVar13 = LinkArticulatedBodyInertias::operator()(this_02,LVar7);
        memcpy(local_2a8,pAVar13,0xd8);
        pSVar1 = (bufs->dVb_linkBiasWrench).
                 super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iDynTree::ArticulatedBodyInertia::asMatrix();
        local_450 = (bufs->dVb_linkBiasAcceleration).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start + LVar7;
        local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[0] = (double)&local_1c8;
        local_470._0_8_ = (HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)(pSVar1 + LVar7);
        local_460.m_value = (long)local_3c8;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)&local_3f8,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)local_470);
      }
      LVar9 = Link::getIndex(pLVar6);
      pJVar10 = FreeFloatingPos::jointPos(robotPos);
      (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar10,LVar9,LVar7);
      iDynTree::Transform::asAdjointTransformWrench();
      local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)((bufs->dVb_linkBiasWrench).
                     super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                     ._M_impl.super__Vector_impl_data._M_start + LVar9);
      local_470._0_8_ = (HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_3c8;
      local_460.m_value = (long)&local_1c8;
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>> *)
                 &local_3f8,
                 (MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)local_470);
    }
  }
  for (uVar20 = 0; uVar4 = Traversal::getNrOfVisitedLinks(traversal), uVar20 < uVar4;
      uVar20 = uVar20 + 1) {
    pLVar6 = Traversal::getLink(traversal,uVar20);
    LVar7 = Link::getIndex(pLVar6);
    pLVar6 = Traversal::getParentLink(traversal,uVar20);
    pIVar8 = Traversal::getParentJoint(traversal,uVar20);
    if (pLVar6 == (Link *)0x0) {
      LinkArticulatedBodyInertias::operator()(this_02,LVar7);
      iDynTree::ArticulatedBodyInertia::asMatrix();
      local_470._0_8_ = (HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_3c8;
      Eigen::
      MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>::
      householderQr(&local_1c8,
                    (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                     *)local_470);
      local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)((bufs->dVb_linkBiasWrench).
                     super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                     ._M_impl.super__Vector_impl_data._M_start + LVar7);
      local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
      m_data[1] = (double)&local_3f8;
      local_480[0] = (HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)
                     ((bufs->dVb_linksAccelerations).
                      super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      ._M_impl.super__Vector_impl_data._M_start + LVar7);
      local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
      m_data[0] = (double)&local_1c8;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>const>>
                ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_480,
                 (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)local_2a8);
      local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
      m_data[0] = (double)((bufs->dVb_linksAccelerations).
                           super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                           ._M_impl.super__Vector_impl_data._M_start + LVar7);
      toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_3c8,
              &A->super_MatrixDynSize);
      sVar19 = Model::getNrOfDOFs(model);
      sVar18 = Model::getNrOfDOFs(model);
      local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[7] = (double)(sVar18 + 6);
      local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0] = (double)((double *)(local_3c8._0_8_ + 0x30) +
                         sVar18 + local_3c8._16_8_ * (long)(sVar19 + 6));
      local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[4] = (double)local_3c8._16_8_;
      local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[2] = (double)local_3c8._0_8_;
      local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[3] = (double)local_3c8._8_8_;
      local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[8] = (double)local_3c8._16_8_;
      local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[6] = (double)(sVar19 + 6);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,6,6,false>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_6,_6,_false>
                  *)&local_1c8,
                 (Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_2a8);
    }
    else {
      LVar9 = Link::getIndex(pLVar6);
      iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
      if (iVar5 == 0) {
        pJVar10 = FreeFloatingPos::jointPos(robotPos);
        (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar10,LVar7,LVar9);
        iDynTree::Transform::asAdjointTransform();
        pSVar2 = (bufs->dVb_linksAccelerations).
                 super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_3c8._16_8_ = pSVar2 + LVar9;
        local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
        m_data[0] = (double)(pSVar2 + LVar7);
        local_3c8._32_8_ =
             (bufs->dVb_linkBiasAcceleration).
             super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
             ._M_impl.super__Vector_impl_data._M_start + LVar7;
        local_3c8._0_8_ = &local_1c8;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_2a8,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_3c8);
      }
      else {
        iVar5 = (*pIVar8->_vptr_IJoint[0x18])(pIVar8);
        sVar19 = CONCAT44(extraout_var_02,iVar5);
        pJVar10 = FreeFloatingPos::jointPos(robotPos);
        (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar10,LVar7,LVar9);
        iDynTree::Transform::asAdjointTransform();
        pSVar2 = (bufs->dVb_linksAccelerations).
                 super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_3c8._16_8_ = pSVar2 + LVar9;
        local_3c8._32_8_ =
             (bufs->dVb_linkBiasAcceleration).
             super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
             ._M_impl.super__Vector_impl_data._M_start + LVar7;
        local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
        m_data[0] = (double)(pSVar2 + LVar7);
        local_3c8._0_8_ = &local_1c8;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_2a8,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_3c8);
        pMVar3 = (bufs->dVb_u).
                 super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar16 = DOFSpatialForceArray::operator()(this,sVar19);
        toEigen((Matrix<double,_6,_1,_0,_6,_1> *)local_2a8,pSVar16);
        pSVar2 = (bufs->dVb_linksAccelerations).
                 super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar17 = (undefined8 *)
                  iDynTree::VectorDynSize::operator()(&this_00->super_VectorDynSize,sVar19);
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[8] = (double)*puVar17;
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[1] = (double)(pMVar3 + sVar19);
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[3] = (double)local_2a8;
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[4] = (double)(pSVar2 + LVar7);
        toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_470,
                &A->super_MatrixDynSize);
        sVar18 = Model::getNrOfDOFs(model);
        dVar21 = (double)(sVar19 + sVar18 + 0xc);
        sVar18 = Model::getNrOfDOFs(model);
        local_3c8._56_8_ = sVar18 + 6;
        local_3c8._0_8_ =
             (long)((((MatrixType *)local_470._0_8_)->
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.
                    array + 4) + 0x10 + (sVar18 + local_460.m_value * (long)dVar21) * 8;
        local_3c8._32_8_ = local_460.m_value;
        local_3c8._16_8_ = local_470._0_8_;
        local_3c8._24_8_ = local_470._8_8_;
        local_3c8._64_8_ = local_460.m_value;
        local_3c8._48_8_ = dVar21;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,1,6,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>const>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,6,1,1,6>const>const>>
                  ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>
                    *)local_3c8,
                   (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_>
                    *)&local_1c8);
        pSVar2 = (bufs->dVb_linksAccelerations).
                 super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar15 = DOFSpatialMotionArray::operator()((DOFSpatialMotionArray *)bufs,sVar19);
        toEigen((Matrix<double,_6,_1,_0,_6,_1> *)local_3c8,pSVar15);
        toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_2a8,
                &A->super_MatrixDynSize);
        sVar18 = Model::getNrOfDOFs(model);
        dVar21 = (double)(sVar19 + sVar18 + 0xc);
        sVar19 = Model::getNrOfDOFs(model);
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[10] = (double)(sVar19 + 6);
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[3] = (double)(((Matrix6x6 *)
                             local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.
                             linearVec3.super_Vector3.m_data[0])->m_data +
                            (long)local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.
                                  linearVec3.super_Vector3.m_data[2] * (long)dVar21 + sVar19 + 6);
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[5] = local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
                    super_Vector3.m_data[0];
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[6] = local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
                    super_Vector3.m_data[1];
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[2] = (double)local_3c8;
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[7] = local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
                    super_Vector3.m_data[2];
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[0xb] = local_2a8[0].super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
                      super_Vector3.m_data[2];
        local_470._0_8_ =
             (bufs->dVb_linksAccelerations).
             super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
             ._M_impl.super__Vector_impl_data._M_start + LVar7;
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[0] = (double)(pSVar2 + LVar7);
        local_1c8.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
        .array[9] = dVar21;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,1,6,false>,0>const>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_470,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>,_0>_>
                    *)&local_1c8);
      }
    }
  }
  return;
}

Assistant:

void ForwardDynamicsLinearizationWrtBaseTwist(const Model& model,
                                              const Traversal& traversal,
                                              const FreeFloatingPos& robotPos,
                                              const FreeFloatingVel& robotVel,
                                              const LinkNetExternalWrenches& linkExtWrenches,
                                              const JointDOFsDoubleArray& jointTorques,
                                              ForwardDynamicsLinearizationInternalBuffers & bufs,
                                              FreeFloatingAcc& robotAcc,
                                              FreeFloatingStateLinearization& A)
{
    //std::cout << "ForwardDynamicsLinearizationWrtBaseTwist A : " << A.toString() << std::endl;
    /**
     * Forward pass: compute the derivatives of  link velocities and of link bias accelerations
     * with respect to the base twist.
     * In particur, the derivative of the linkVelocity[l] with respect to the base velocity
     * is just the \f$ ~^b X_l \f$ transform, so we just compute that transform for the derivative
     * of link velocity with respect to base velocity.
     * We don't such a strong structure for the derivative with respect to the link bias acceleration,
     * so store it as a 6x6 matrix.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // Propagate the derivatives of velocities and bias accelerations

        // If the visitedLink is the base one, initialize the derivative of the link velocity
        // with respect to the base velocity to identiy
        if( parentLink == 0 )
        {
            bufs.linkPos(visitedLinkIndex) = iDynTree::Transform::Identity();
            bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
        }
        else
        {
            LinkIndex    parentLinkIndex = parentLink->getIndex();
            bufs.linkPos(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLink->getIndex())*bufs.linkPos(parentLinkIndex);

            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
            }
            else
            {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               double dql      = robotVel.jointVel()(dofIndex);
               iDynTree::SpatialMotionVector & S = bufs.aba.S(dofIndex);

               toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]) = toEigen((S*(-dql)).asCrossProductMatrix())*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());
            }
        }

       //std::cout << " dVl_linkLocalBiasWrench : " << bufs.dVl_linkLocalBiasWrench[visitedLinkIndex].toString() << std::endl;
       toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]) = toEigen(bufs.dVl_linkLocalBiasWrench[visitedLinkIndex])*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());


    }

    /*
     * Backward pass: recursivly compute
     * the derivative of articulated body bias wrench
     * with respect to the base velocity.
     *
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);


        if( parentLink )
        {
            // For now we support only 0 and 1 dof joints
            Matrix6x6 dVb_pa;
            ArticulatedBodyInertia Ia;

            // for 1 dof joints, the articulated inertia
            // need to be propagated to the parent considering
            // the joints
            if( toParentJoint->getNrOfDOFs() > 0 )
            {
                assert(toParentJoint->getNrOfDOFs()==1);
                size_t dofIndex = toParentJoint->getDOFsOffset();

                Ia = bufs.aba.linkABIs(visitedLinkIndex)
                    - ArticulatedBodyInertia::ABADyadHelper(bufs.aba.U(dofIndex),bufs.aba.D(dofIndex));

                toEigen(bufs.dVb_u[dofIndex]) = -toEigen(bufs.aba.S(dofIndex)).transpose()*toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]);
                toEigen(dVb_pa)  =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex])
                                     + toEigen(bufs.aba.U(dofIndex))*toEigen(bufs.dVb_u[dofIndex])/bufs.aba.D(dofIndex);

            }

            // For fixed joints, we just need to propate
            // the articulated quantities without considering the
            // joint
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                Ia = bufs.aba.linkABIs(visitedLinkIndex);
                toEigen(dVb_pa)   =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
            }

            // Propagate
            LinkIndex parentLinkIndex = parentLink->getIndex();
            const Transform & parent_X_visited = toParentJoint->getTransform(robotPos.jointPos(),parentLinkIndex,visitedLinkIndex);
            toEigen(bufs.dVb_linkBiasWrench[parentLinkIndex]) += toEigen(parent_X_visited.asAdjointTransformWrench())*toEigen(dVb_pa);
        }
    }


    /**
     * Second forward pass: find robot accelerations
     *
     */
    // \todo TODO Handle gravity
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
       LinkConstPtr visitedLink = traversal.getLink(traversalEl);
       LinkIndex visitedLinkIndex = visitedLink->getIndex();
       LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
       IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

       if( parentLink == 0 )
       {
           // Preliminary step: find base acceleration
           //std::cout << "bufs.dVb_linkBiasWrench : "<<  bufs.dVb_linkBiasWrench[visitedLinkIndex].toString() << std::endl;
           toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = -toEigen(bufs.aba.linkABIs(visitedLinkIndex).asMatrix()).householderQr().solve(toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]));
           // Start storing the result in the linearization matrix
           toEigen(A).block<6,6>(6+model.getNrOfDOFs(),6+model.getNrOfDOFs()) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]);
           /*
           std::cout << "Acceleration setted : " << std::endl;
           std::cout << toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) << std::endl;
           std::cout << "Resulting A " << std::endl;
           */
        }
       else
       {
           LinkIndex    parentLinkIndex = parentLink->getIndex();
           if( toParentJoint->getNrOfDOFs() > 0 )
           {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               assert(toParentJoint->getNrOfDOFs()==1);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
               toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs())  = (toEigen(bufs.dVb_u[dofIndex]) - toEigen(bufs.aba.U(dofIndex)).transpose()*toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]))/bufs.aba.D(dofIndex);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) + toEigen(bufs.aba.S(dofIndex))*toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs());
           }
           else
           {
               //for fixed joints we just propagate the acceleration
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
           }
       }
    }
}